

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O3

string * setup::filename_map::shorten_path(string *__return_storage_ptr__,string *path)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  it s_begin;
  char *pcVar8;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (path->_M_string_length != 0) {
    pcVar4 = (path->_M_dataplus)._M_p;
    pcVar7 = pcVar4 + path->_M_string_length;
    do {
      lVar3 = (long)pcVar7 - (long)pcVar4 >> 2;
      pcVar8 = pcVar4;
      pcVar5 = pcVar7;
      if (0 < lVar3) {
        lVar3 = lVar3 + 1;
        pcVar1 = pcVar4 + 3;
        do {
          if ((pcVar1[-3] == '/') || (pcVar1[-3] == '\\')) {
            pcVar1 = pcVar1 + -3;
            goto LAB_00136350;
          }
          if ((pcVar1[-2] == '/') || (pcVar1[-2] == '\\')) {
            pcVar1 = pcVar1 + -2;
            goto LAB_00136350;
          }
          if ((pcVar1[-1] == '/') || (pcVar1[-1] == '\\')) {
            pcVar1 = pcVar1 + -1;
            goto LAB_00136350;
          }
          if ((*pcVar1 == '/') || (*pcVar1 == '\\')) goto LAB_00136350;
          lVar3 = lVar3 + -1;
          pcVar1 = pcVar1 + 4;
          pcVar8 = pcVar4 + ((long)pcVar7 - (long)pcVar4 & 0xfffffffffffffffc);
        } while (1 < lVar3);
      }
      pcVar1 = pcVar8;
      lVar3 = (long)pcVar7 - (long)pcVar1;
      pcVar8 = pcVar7;
      if (lVar3 == 1) {
LAB_00136328:
        if ((*pcVar1 == '/') || (*pcVar1 == '\\')) goto LAB_00136350;
      }
      else {
        if (lVar3 == 2) {
LAB_00136317:
          if ((*pcVar1 != '/') && (*pcVar1 != '\\')) {
            pcVar1 = pcVar1 + 1;
            goto LAB_00136328;
          }
        }
        else {
          if (lVar3 != 3) goto LAB_0013635b;
          if ((*pcVar1 != '/') && (*pcVar1 != '\\')) {
            pcVar1 = pcVar1 + 1;
            goto LAB_00136317;
          }
        }
LAB_00136350:
        pcVar5 = pcVar1 + 1;
        pcVar8 = pcVar1;
        if (pcVar1 == pcVar7) {
          pcVar5 = pcVar7;
        }
      }
LAB_0013635b:
      if (pcVar8 != pcVar4) {
        if ((long)pcVar8 - (long)pcVar4 == 1) {
          if (*pcVar4 != '.') goto LAB_001363ac;
        }
        else if ((((long)pcVar8 - (long)pcVar4 == 2) && (*pcVar4 == '.')) && (pcVar4[1] == '.')) {
          lVar2 = std::__cxx11::string::rfind((char)__return_storage_ptr__,0x2f);
          lVar3 = 0;
          if (lVar2 != -1) {
            lVar3 = lVar2;
          }
          std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar3);
        }
        else {
LAB_001363ac:
          if (__return_storage_ptr__->_M_string_length == 0) {
            uVar6 = 0;
          }
          else {
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
            uVar6 = __return_storage_ptr__->_M_string_length;
          }
          std::__cxx11::string::replace
                    ((ulong)__return_storage_ptr__,uVar6,(char *)0x0,(ulong)pcVar4);
        }
      }
      pcVar4 = pcVar5;
    } while (pcVar5 != pcVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string filename_map::shorten_path(const std::string & path) {
	
	std::string result;
	result.reserve(path.size());
	
	it begin = path.begin();
	it end = path.end();
	while(begin != end) {
		
		it s_begin = begin;
		it s_end = std::find_if(begin, end, is_path_separator());
		begin = (s_end == end) ? end : (s_end + 1);
		
		size_t segment_length = size_t(s_end - s_begin);
		
		// Empty segment - ignore
		if(segment_length == 0) {
			continue;
		}
		
		// '.' segment - ignore
		if(segment_length == 1 && *s_begin == '.') {
			continue;
		}
		
		// '..' segment - backtrace in result path
		if(segment_length == 2 && *s_begin == '.' && *(s_begin + 1) == '.') {
			size_t last_sep = result.find_last_of(path_sep);
			if(last_sep == std::string::npos) {
				last_sep = 0;
			}
			result.resize(last_sep);
			continue;
		}
		
		// Normal segment - append to the result path
		if(!result.empty()) {
			result.push_back(path_sep);
		}
		result.append(s_begin, s_end);
		
	}
	
	return result;
}